

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O0

void Rwr_Trav_rec(Rwr_Man_t *p,Rwr_Node_t *pNode,int *pVolume)

{
  Rwr_Node_t *pRVar1;
  int *pVolume_local;
  Rwr_Node_t *pNode_local;
  Rwr_Man_t *p_local;
  
  if (((*(uint *)&pNode->field_0xe >> 0x1e & 1) == 0) && (pNode->TravId != p->nTravIds)) {
    pNode->TravId = p->nTravIds;
    *pVolume = *pVolume + 1;
    if (*(int *)&pNode->field_0xe < 0) {
      *pVolume = *pVolume + 1;
    }
    pRVar1 = Rwr_Regular(pNode->p0);
    Rwr_Trav_rec(p,pRVar1,pVolume);
    pRVar1 = Rwr_Regular(pNode->p1);
    Rwr_Trav_rec(p,pRVar1,pVolume);
  }
  return;
}

Assistant:

void Rwr_Trav_rec( Rwr_Man_t * p, Rwr_Node_t * pNode, int * pVolume )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    (*pVolume)++;
    if ( pNode->fExor )
        (*pVolume)++;
    Rwr_Trav_rec( p, Rwr_Regular(pNode->p0), pVolume );
    Rwr_Trav_rec( p, Rwr_Regular(pNode->p1), pVolume );
}